

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avsd_parse.c
# Opt level: O2

AvsdFrame_t * get_one_save(AvsdCtx_t *p_dec,HalDecTask *task)

{
  long lVar1;
  long lVar2;
  AvsdFrame_t *pAVar3;
  
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (lVar2 + 0x40 == 0x100) {
      _mpp_log_l(2,"avsd_parse","mem_save dpb %d slots has not get\n",(char *)0x0,3);
      return (AvsdFrame_t *)0x0;
    }
    lVar1 = lVar2 + 0x40;
  } while (*(int *)((long)&p_dec->mem->save[0].valid + lVar2) != 0);
  pAVar3 = (AvsdFrame_t *)((long)&p_dec->mem->save[0].valid + lVar2);
  pAVar3->valid = 1;
  return pAVar3;
}

Assistant:

static AvsdFrame_t *get_one_save(AvsdCtx_t *p_dec, HalDecTask *task)
{
    RK_U32 i = 0;
    AvsdFrame_t *p_cur = NULL;

    for (i = 0; i < MPP_ARRAY_ELEMS(p_dec->mem->save); i++) {
        if (!p_dec->mem->save[i].valid) {
            p_dec->mem->save[i].valid = 1;
            p_cur = &p_dec->mem->save[i];
            break;
        }
    }
    if (!p_cur) {
        mpp_err("mem_save dpb %d slots has not get\n", MPP_ARRAY_ELEMS(p_dec->mem->save));
        goto __FAILED;
    }
    (void)task;
    return p_cur;
__FAILED:
    reset_one_save(p_cur);

    return NULL;
}